

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtUtxoDataByIndex
              (void *handle,void *psbt_handle,uint32_t index,char **txid,uint32_t *vout,
              int64_t *amount,char **locking_script,char **redeem_script,char **descriptor,
              char **full_tx_hex)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t index_00;
  undefined8 uVar4;
  int64_t iVar5;
  ulong uVar6;
  size_type sVar7;
  reference this;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  uint32_t *in_R8;
  int64_t *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  KeyData *key;
  iterator __end5;
  iterator __begin5;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range5;
  bool is_find;
  Pubkey *pubkey;
  iterator __end4;
  iterator __begin4;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range4;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> multisig_key_list;
  uint32_t req_num;
  Script temp_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  TxOutReference txout;
  Transaction tx;
  Script script;
  UtxoData utxo;
  OutPoint outpoint;
  TxInReference txin;
  CfdCapiPsbtHandle *psbt_obj;
  char *work_tx;
  char *work_descriptor;
  char *work_redeem_script;
  char *work_locking_script;
  char *work_txid;
  int result;
  AbstractTxInReference *in_stack_fffffffffffff4d8;
  UtxoData *in_stack_fffffffffffff4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4f0;
  HardenedType in_stack_fffffffffffff4f4;
  CfdError in_stack_fffffffffffff4fc;
  uint uVar8;
  CfdException *in_stack_fffffffffffff500;
  reference this_00;
  undefined4 in_stack_fffffffffffff50c;
  undefined4 uVar9;
  char *in_stack_fffffffffffff528;
  string *in_stack_fffffffffffff540;
  string local_a78;
  string local_a58 [32];
  string local_a38 [32];
  string *in_stack_fffffffffffff5e8;
  void *in_stack_fffffffffffff5f0;
  string local_9f8 [32];
  string local_9d8;
  string local_9b8 [32];
  Pubkey local_998;
  reference local_980;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_978;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_970;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_968;
  byte local_959;
  reference local_958;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_950;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_948;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *local_940;
  string local_938 [32];
  string local_918 [32];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_8f8;
  uint32_t local_8dc;
  Script local_8d8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_8a0;
  string local_888;
  TxOutReference local_868 [2];
  Transaction local_7c8;
  string local_788;
  Script local_768;
  string local_730 [3];
  Script local_6c0 [8];
  string local_4d8 [32];
  Amount local_4b8 [41];
  Txid local_220;
  string local_200;
  OutPoint local_1e0;
  Transaction local_1b8;
  TxInReference local_178;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  CfdSourceLocation local_c0;
  long local_a8;
  allocator local_99;
  string local_98 [48];
  char *local_68;
  char *local_60;
  char *local_58;
  string *local_50;
  char *local_48;
  undefined4 local_3c;
  int64_t *local_38;
  uint32_t *local_30;
  undefined8 *local_28;
  uint32_t local_1c;
  long local_18;
  int local_4;
  
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (string *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"PsbtHandle",&local_99);
  cfd::capi::CheckBuffer(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_a8 = local_18;
  if (*(long *)(local_18 + 0x18) == 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x49a;
    local_c0.funcname = "CfdGetPsbtUtxoDataByIndex";
    cfd::core::logger::warn<>(&local_c0,"psbt is null.");
    local_e2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Failed to handle statement. psbt is null.",&local_e1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4fc,
               (string *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
    local_e2 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Psbt::GetTransaction(&local_1b8,*(Psbt **)(local_18 + 0x18));
  cfd::core::Transaction::GetTxIn(&local_178,&local_1b8,local_1c);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff4e0);
  cfd::core::AbstractTxInReference::GetOutPoint(in_stack_fffffffffffff4d8);
  if (local_28 != (undefined8 *)0x0) {
    cfd::core::OutPoint::GetTxid(&local_220,&local_1e0);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_200,&local_220);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffff540);
    std::__cxx11::string::~string((string *)&local_200);
    cfd::core::Txid::~Txid((Txid *)0x5f22d1);
  }
  if (local_30 != (uint32_t *)0x0) {
    uVar2 = cfd::core::OutPoint::GetVout(&local_1e0);
    *local_30 = uVar2;
  }
  cfd::Psbt::GetUtxoData
            ((Psbt *)work_locking_script,work_redeem_script._4_4_,(NetType)work_redeem_script);
  bVar1 = cfd::core::Script::IsEmpty(local_6c0);
  if (!bVar1) {
    if (in_stack_00000008 != (undefined8 *)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_(local_730,local_6c0);
      in_stack_fffffffffffff540 = (string *)cfd::capi::CreateString(in_stack_fffffffffffff540);
      local_50 = in_stack_fffffffffffff540;
      std::__cxx11::string::~string((string *)local_730);
    }
    if (local_38 != (int64_t *)0x0) {
      iVar5 = cfd::core::Amount::GetSatoshiValue(local_4b8);
      *local_38 = iVar5;
    }
  }
  cfd::core::Psbt::GetTxInRedeemScript
            (&local_768,*(Psbt **)(local_a8 + 0x18),local_1c,true,(bool *)0x0);
  bVar1 = cfd::core::Script::IsEmpty(&local_768);
  if (((!bVar1) && (bVar1 = cfd::core::Script::IsP2wpkhScript(&local_768), !bVar1)) &&
     (in_stack_00000010 != (undefined8 *)0x0)) {
    cfd::core::Script::GetHex_abi_cxx11_(&local_788,&local_768);
    in_stack_fffffffffffff528 = cfd::capi::CreateString(in_stack_fffffffffffff540);
    local_58 = in_stack_fffffffffffff528;
    std::__cxx11::string::~string((string *)&local_788);
  }
  cfd::core::Psbt::GetTxInUtxoFull(&local_7c8,*(Psbt **)(local_a8 + 0x18),local_1c,true,(bool *)0x0)
  ;
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)in_stack_fffffffffffff540);
  uVar2 = cfd::core::Transaction::GetTxOutCount(&local_7c8);
  uVar3 = cfd::core::OutPoint::GetVout(&local_1e0);
  if (uVar3 < uVar2) {
    index_00 = cfd::core::OutPoint::GetVout(&local_1e0);
    cfd::core::Transaction::GetTxOut(local_868,&local_7c8,index_00);
    cfd::core::TxOutReference::operator=
              ((TxOutReference *)in_stack_fffffffffffff4e0,
               (TxOutReference *)in_stack_fffffffffffff4d8);
    cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x5f2674);
    if (in_stack_00000020 != (undefined8 *)0x0) {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                (&local_888,&local_7c8.super_AbstractTransaction);
      local_68 = cfd::capi::CreateString(in_stack_fffffffffffff540);
      std::__cxx11::string::~string((string *)&local_888);
    }
  }
  cfd::core::Psbt::GetTxInKeyDataList(&local_8a0,*(Psbt **)(local_a8 + 0x18),local_1c);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) goto LAB_005f2e20;
  cfd::core::AbstractTxOutReference::GetLockingScript
            ((AbstractTxOutReference *)in_stack_fffffffffffff4d8);
  bVar1 = cfd::core::Script::IsP2shScript(&local_8d8);
  uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff50c);
  if (bVar1) {
    bVar1 = cfd::core::Script::IsMultisigScript(&local_768);
    uVar8 = CONCAT13((char)((uint)uVar9 >> 0x18),CONCAT12(bVar1,(short)uVar9));
    if (!bVar1) goto LAB_005f2ca8;
    local_8dc = 0;
    cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_8f8,&local_768,&local_8dc);
    std::__cxx11::to_string(uVar8);
    std::operator+((char *)in_stack_fffffffffffff4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0);
    std::__cxx11::string::operator=(local_4d8,local_918);
    std::__cxx11::string::~string(local_918);
    std::__cxx11::string::~string(local_938);
    local_940 = &local_8f8;
    local_948._M_current =
         (Pubkey *)
         std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                   ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                    in_stack_fffffffffffff4d8);
    local_950._M_current =
         (Pubkey *)
         std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                   ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                    in_stack_fffffffffffff4d8);
    while (bVar1 = __gnu_cxx::operator!=(&local_948,&local_950), bVar1) {
      local_958 = __gnu_cxx::
                  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  ::operator*(&local_948);
      local_959 = 0;
      local_968 = &local_8a0;
      local_970._M_current =
           (KeyData *)
           std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(local_968);
      local_978._M_current =
           (KeyData *)
           std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_968);
      while (bVar1 = __gnu_cxx::operator!=(&local_970,&local_978), bVar1) {
        local_980 = __gnu_cxx::
                    __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                    ::operator*(&local_970);
        this_00 = local_958;
        cfd::core::KeyData::GetPubkey(&local_998,local_980);
        bVar1 = cfd::core::Pubkey::Equals(this_00,&local_998);
        uVar8 = (uint)bVar1 << 0x18;
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f299f);
        if ((uVar8 & 0x1000000) != 0) {
          cfd::core::KeyData::ToString_abi_cxx11_(&local_9d8,local_980,true,kApostrophe,false);
          std::operator+((char *)in_stack_fffffffffffff4e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff4e0);
          std::__cxx11::string::operator+=(local_4d8,local_9b8);
          std::__cxx11::string::~string(local_9b8);
          std::__cxx11::string::~string((string *)&local_9d8);
          local_959 = 1;
        }
        __gnu_cxx::
        __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
        ::operator++(&local_970);
      }
      if ((local_959 & 1) == 0) {
        cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&stack0xfffffffffffff5e8,local_958);
        std::operator+((char *)in_stack_fffffffffffff4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4e0);
        std::__cxx11::string::operator+=(local_4d8,local_9f8);
        std::__cxx11::string::~string(local_9f8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff5e8);
      }
      __gnu_cxx::
      __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
      ::operator++(&local_948);
    }
    std::operator+(in_stack_fffffffffffff528,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar2,uVar3));
    std::operator+(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
    std::__cxx11::string::operator=(local_4d8,local_a38);
    std::__cxx11::string::~string(local_a38);
    std::__cxx11::string::~string(local_a58);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
               CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
  }
  else {
LAB_005f2ca8:
    bVar1 = cfd::core::Script::IsP2pkhScript(&local_8d8);
    if (((bVar1) || (bVar1 = cfd::core::Script::IsP2pkScript(&local_8d8), bVar1)) &&
       (sVar7 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size
                          (&local_8a0), sVar7 == 1)) {
      bVar1 = cfd::core::Script::IsP2pkhScript(&local_8d8);
      if (bVar1) {
        std::__cxx11::string::operator=(local_4d8,"pkh(");
      }
      else {
        bVar1 = cfd::core::Script::IsP2pkScript(&local_8d8);
        if (bVar1) {
          std::__cxx11::string::operator=(local_4d8,"pk(");
        }
      }
      in_stack_fffffffffffff4f4 = kApostrophe;
      this = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       (&local_8a0,0);
      cfd::core::KeyData::ToString_abi_cxx11_
                (&local_a78,this,true,in_stack_fffffffffffff4f4,SUB41(in_stack_fffffffffffff4f4,0));
      std::__cxx11::string::operator+=(local_4d8,(string *)&local_a78);
      std::__cxx11::string::~string((string *)&local_a78);
      std::__cxx11::string::operator+=(local_4d8,")");
    }
  }
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff4e0);
LAB_005f2e20:
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) == 0) && (in_stack_00000018 != (undefined8 *)0x0)) {
    local_60 = cfd::capi::CreateString(in_stack_fffffffffffff540);
  }
  if (local_28 != (undefined8 *)0x0) {
    *local_28 = local_48;
  }
  if (in_stack_00000008 != (undefined8 *)0x0) {
    *in_stack_00000008 = local_50;
  }
  if (in_stack_00000010 != (undefined8 *)0x0) {
    *in_stack_00000010 = local_58;
  }
  if (in_stack_00000018 != (undefined8 *)0x0) {
    *in_stack_00000018 = local_60;
  }
  if (in_stack_00000020 != (undefined8 *)0x0) {
    *in_stack_00000020 = local_68;
  }
  local_4 = 0;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x5f2f1f);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff4e0);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff4e0);
  cfd::UtxoData::~UtxoData(in_stack_fffffffffffff4e0);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5f2f53);
  cfd::core::TxInReference::~TxInReference((TxInReference *)0x5f2f60);
  return local_4;
}

Assistant:

int CfdGetPsbtUtxoDataByIndex(
    void* handle, void* psbt_handle, uint32_t index, char** txid,
    uint32_t* vout, int64_t* amount, char** locking_script,
    char** redeem_script, char** descriptor, char** full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_locking_script = nullptr;
  char* work_redeem_script = nullptr;
  char* work_descriptor = nullptr;
  char* work_tx = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    auto txin = psbt_obj->psbt->GetTransaction().GetTxIn(index);
    OutPoint outpoint = txin.GetOutPoint();
    if (txid != nullptr) {
      work_txid = CreateString(outpoint.GetTxid().GetHex());
    }
    if (vout != nullptr) *vout = outpoint.GetVout();

    auto utxo = psbt_obj->psbt->GetUtxoData(index);
    if (!utxo.locking_script.IsEmpty()) {
      if (locking_script != nullptr) {
        work_locking_script = CreateString(utxo.locking_script.GetHex());
      }
      if (amount != nullptr) *amount = utxo.amount.GetSatoshiValue();
    }

    Script script = psbt_obj->psbt->GetTxInRedeemScript(index, true);
    if ((!script.IsEmpty()) && (!script.IsP2wpkhScript()) &&
        (redeem_script != nullptr)) {
      work_redeem_script = CreateString(script.GetHex());
    }

    auto tx = psbt_obj->psbt->GetTxInUtxoFull(index, true);
    TxOutReference txout;
    if (tx.GetTxOutCount() > outpoint.GetVout()) {
      txout = tx.GetTxOut(outpoint.GetVout());
      if (full_tx_hex != nullptr) work_tx = CreateString(tx.GetHex());
    }

    auto key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
    if (utxo.descriptor.empty()) {
      Script temp_script = txout.GetLockingScript();
      if (temp_script.IsP2shScript() && script.IsMultisigScript()) {
        uint32_t req_num = 0;
        auto multisig_key_list =
            ScriptUtil::ExtractPubkeysFromMultisigScript(script, &req_num);
        utxo.descriptor = "multi(" + std::to_string(req_num);
        for (const auto& pubkey : multisig_key_list) {
          bool is_find = false;
          for (const auto& key : key_list) {
            if (pubkey.Equals(key.GetPubkey())) {
              utxo.descriptor += "," + key.ToString();
              is_find = true;
            }
          }
          if (!is_find) {
            utxo.descriptor += "," + pubkey.GetHex();
          }
        }
        utxo.descriptor = "sh(" + utxo.descriptor + ")";
      } else if (temp_script.IsP2pkhScript() || temp_script.IsP2pkScript()) {
        if (key_list.size() == 1) {
          if (temp_script.IsP2pkhScript())
            utxo.descriptor = "pkh(";
          else if (temp_script.IsP2pkScript())
            utxo.descriptor = "pk(";
          utxo.descriptor += key_list[0].ToString();
          utxo.descriptor += ")";
        }
      }
    }
    if ((!utxo.descriptor.empty()) && (descriptor != nullptr)) {
      work_descriptor = CreateString(utxo.descriptor);
    }

    if (txid != nullptr) *txid = work_txid;
    if (locking_script != nullptr) *locking_script = work_locking_script;
    if (redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (descriptor != nullptr) *descriptor = work_descriptor;
    if (full_tx_hex != nullptr) *full_tx_hex = work_tx;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_txid, &work_locking_script, &work_redeem_script, &work_descriptor,
      &work_tx);
  return result;
}